

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O1

Var Js::JavascriptMap::EntryForEach(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  Entry *pEVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptMap *pJVar6;
  RecyclableObject *pRVar7;
  JavascriptMethod p_Var8;
  int in_stack_00000010;
  undefined1 local_a8 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo local_78;
  CallInfo callInfo_local;
  ArgumentReader args;
  Iterator iterator;
  Entry *local_48;
  ScriptContext *local_40;
  bool local_31;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_78 = callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != local_78._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x9a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  callInfo_local = local_78;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_78);
  local_40 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_a8,function,local_78,L"Map.prototype.forEach",
             &stack0x00000000);
  pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  bVar3 = VarIs<Js::JavascriptMap>(pvVar5);
  if (bVar3) {
    pJVar6 = UnsafeVarTo<Js::JavascriptMap>(pvVar5);
  }
  else {
    pJVar6 = (JavascriptMap *)0x0;
  }
  if (pJVar6 != (JavascriptMap *)0x0) {
    if (((ulong)callInfo_local & 0xfffffe) != 0) {
      pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      bVar3 = JavascriptConversion::IsCallable(pvVar5);
      if (bVar3) {
        pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,1);
        pRVar7 = VarTo<Js::RecyclableObject>(pvVar5);
        if ((callInfo_local._0_4_ & 0xffffff) < 3) {
          iterator.current.ptr =
               (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                *)(((local_40->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).undefinedValue.ptr;
        }
        else {
          iterator.current.ptr =
               (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                *)Arguments::operator[]((Arguments *)&callInfo_local,2);
        }
        Memory::Recycler::WBSetBit((char *)&args.super_Arguments.Values);
        args.super_Arguments.Values = (Type)&pJVar6->list;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&args.super_Arguments.Values);
        while( true ) {
          bVar3 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                  ::Iterator::Next((Iterator *)&args.super_Arguments.Values);
          if (!bVar3) {
            pRVar7 = (((local_40->super_ScriptContextBase).javascriptLibrary)->
                     super_JavascriptLibraryBase).undefinedValue.ptr;
            AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry
                      ((AutoTagNativeLibraryEntry *)local_a8);
            return pRVar7;
          }
          pEVar1 = _DAT_00000010;
          Memory::Recycler::WBSetBit((char *)&local_48);
          local_48 = pEVar1;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
          __tag.entry.next = local_48;
          pEVar1 = pERam0000000000000018;
          Memory::Recycler::WBSetBit((char *)&local_48);
          local_48 = pEVar1;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
          pEVar1 = local_48;
          this = local_40->threadContext;
          local_31 = this->reentrancySafeOrHandled;
          this->reentrancySafeOrHandled = true;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
          if (local_40->threadContext->noJsReentrancy == true) break;
          p_Var8 = RecyclableObject::GetEntryPoint(pRVar7);
          CheckIsExecutable(pRVar7,p_Var8);
          p_Var8 = RecyclableObject::GetEntryPoint(pRVar7);
          (*p_Var8)(pRVar7,(CallInfo)pRVar7,0x2000004,0,0,0,0,0x2000004,iterator.current.ptr,pEVar1,
                    __tag.entry.next,pJVar6);
          this->reentrancySafeOrHandled = local_31;
        }
        Throw::FatalJsReentrancyError();
      }
    }
    JavascriptError::ThrowTypeError(local_40,-0x7ff5ec34,L"Map.prototype.forEach");
  }
  JavascriptError::ThrowTypeErrorVar(local_40,-0x7ff5ec04,L"Map.prototype.forEach",L"Map");
}

Assistant:

Var JavascriptMap::EntryForEach(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Map.prototype.forEach"));

    JavascriptMap* map = JavascriptOperators::TryFromVar<JavascriptMap>(args[0]);
    if (map == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Map.prototype.forEach"), _u("Map"));
    }

    if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Map.prototype.forEach"));
    }
    RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);

    Var thisArg = (args.Info.Count > 2) ? args[2] : scriptContext->GetLibrary()->GetUndefined();

    auto iterator = map->GetIterator();

    while (iterator.Next())
    {
        Var key = iterator.Current().Key();
        Var value = iterator.Current().Value();

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg, value, key, map);
        }
        END_SAFE_REENTRANT_CALL
    }

    return scriptContext->GetLibrary()->GetUndefined();
}